

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O1

bool qt_painterpath_check_crossing(QPainterPath *path,QRectF *rect)

{
  ElementType EVar1;
  QPainterPathPrivate *pQVar2;
  Element *pEVar3;
  qreal x2;
  qreal y2;
  qreal qVar4;
  qreal qVar5;
  qreal qVar6;
  qreal qVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long in_FS_OFFSET;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  qreal local_a8;
  qreal qStack_a0;
  QBezier local_98;
  QPointF local_58;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.xp = 0.0;
  local_48.yp = 0.0;
  local_58.xp = 0.0;
  local_58.yp = 0.0;
  iVar12 = 0;
  iVar13 = 0;
  do {
    pQVar2 = (path->d_ptr).d.ptr;
    iVar11 = 0;
    if (pQVar2 != (QPainterPathPrivate *)0x0) {
      iVar11 = (int)(pQVar2->elements).d.size;
    }
    if (iVar11 <= iVar12) {
      bVar8 = qFuzzyCompare(&local_48,&local_58);
      if (!bVar8) {
        bVar8 = qt_painterpath_isect_line_rect(local_48.xp,local_48.yp,local_58.xp,local_58.yp,rect)
        ;
        bVar10 = true;
        if (bVar8) goto LAB_003e9074;
      }
      bVar10 = false;
      goto LAB_003e9074;
    }
    pEVar3 = (pQVar2->elements).d.ptr;
    x2 = pEVar3[iVar12].x;
    y2 = pEVar3[iVar12].y;
    EVar1 = pEVar3[iVar12].type;
    if (EVar1 == CurveToElement) {
      iVar11 = iVar12 + 2;
      local_a8 = pEVar3[iVar11].x;
      qStack_a0 = pEVar3[iVar11].y;
      local_98.x3 = pEVar3[(long)iVar12 + 1].x;
      local_98.y3 = pEVar3[(long)iVar12 + 1].y;
      local_98.x1 = local_48.xp;
      local_98.y1 = local_48.yp;
      local_98.x2 = x2;
      local_98.y2 = y2;
      local_98.x4 = local_a8;
      local_98.y4 = qStack_a0;
      bVar8 = qt_isect_curve_horizontal(&local_98,rect->yp,rect->xp,rect->w + rect->xp,0);
      if (((!bVar8) &&
          (bVar8 = qt_isect_curve_horizontal
                             (&local_98,rect->yp + rect->h,rect->xp,rect->w + rect->xp,0), !bVar8))
         && (bVar8 = qt_isect_curve_vertical(&local_98,rect->xp,rect->yp,rect->h + rect->yp,0),
            !bVar8)) {
        bVar8 = qt_isect_curve_vertical(&local_98,rect->xp + rect->w,rect->yp,rect->h + rect->yp,0);
        goto LAB_003e8e68;
      }
      goto LAB_003e9023;
    }
    iVar11 = iVar12;
    if (EVar1 == LineToElement) {
      bVar8 = qt_painterpath_isect_line_rect(local_48.xp,local_48.yp,x2,y2,rect);
      local_a8 = x2;
      qStack_a0 = y2;
LAB_003e8e68:
      if (bVar8 != false) goto LAB_003e9023;
      local_48.xp = local_a8;
      local_48.yp = qStack_a0;
      iVar12 = iVar11;
      qVar4 = local_58.xp;
      qVar5 = local_58.yp;
      qVar6 = local_48.xp;
      qVar7 = local_48.yp;
    }
    else {
      qVar4 = local_58.xp;
      qVar5 = local_58.yp;
      qVar6 = local_48.xp;
      qVar7 = local_48.yp;
      if ((EVar1 == MoveToElement) && (qVar4 = x2, qVar5 = y2, qVar6 = x2, qVar7 = y2, 0 < iVar12))
      {
        dVar16 = local_48.xp - local_58.xp;
        uVar14 = -(ulong)(dVar16 < -dVar16);
        uVar15 = -(ulong)(local_48.xp < -local_48.xp);
        dVar17 = (double)(~uVar15 & (ulong)local_48.xp | (ulong)-local_48.xp & uVar15);
        uVar15 = -(ulong)(local_58.xp < -local_58.xp);
        dVar18 = (double)(~uVar15 & (ulong)local_58.xp | (ulong)-local_58.xp & uVar15);
        if (dVar18 <= dVar17) {
          dVar17 = dVar18;
        }
        if ((double)(~uVar14 & (ulong)dVar16 | (ulong)-dVar16 & uVar14) * 1000000000000.0 <= dVar17)
        {
          dVar16 = local_48.yp - local_58.yp;
          uVar14 = -(ulong)(dVar16 < -dVar16);
          uVar15 = -(ulong)(local_48.yp < -local_48.yp);
          dVar17 = (double)(~uVar15 & (ulong)local_48.yp | (ulong)-local_48.yp & uVar15);
          uVar15 = -(ulong)(local_58.yp < -local_58.yp);
          dVar18 = (double)(~uVar15 & (ulong)local_58.yp | (ulong)-local_58.yp & uVar15);
          if (dVar18 <= dVar17) {
            dVar17 = dVar18;
          }
          if (((double)(~uVar14 & (ulong)dVar16 | (ulong)-dVar16 & uVar14) * 1000000000000.0 <=
               dVar17) &&
             (bVar8 = qt_painterpath_isect_line_rect
                                (local_48.xp,local_48.yp,local_58.xp,local_58.yp,rect), bVar8))
          goto LAB_003e9023;
        }
      }
    }
    local_48.yp = qVar7;
    local_48.xp = qVar6;
    local_58.yp = qVar5;
    local_58.xp = qVar4;
    dVar17 = rect->xp;
    iVar11 = iVar12;
    if ((local_48.xp != dVar17) || (NAN(local_48.xp) || NAN(dVar17))) {
      dVar16 = rect->w + dVar17;
      if ((local_48.xp == dVar16) && (!NAN(local_48.xp) && !NAN(dVar16))) goto LAB_003e8e9e;
LAB_003e8ebe:
      dVar16 = rect->yp;
      if ((local_48.yp != dVar16) || (NAN(local_48.yp) || NAN(dVar16))) {
        if (dVar17 <= local_48.xp) {
          dVar16 = dVar16 + rect->h;
          if ((local_48.yp == dVar16) && (!NAN(local_48.yp) && !NAN(dVar16))) goto LAB_003e8fc4;
        }
      }
      else if (dVar17 <= local_48.xp) {
LAB_003e8fc4:
        if (local_48.xp <= dVar17 + rect->w) goto LAB_003e8ff1;
      }
      bVar9 = QRectF::contains((QPointF *)rect);
      if (iVar13 == 0) {
        iVar13 = 2 - (uint)bVar9;
        goto LAB_003e9027;
      }
      if (iVar13 == 1) {
        iVar13 = 1;
        if (bVar9 != 0) goto LAB_003e9027;
      }
      else {
        iVar13 = 2;
        if (bVar9 == 0) goto LAB_003e9027;
      }
LAB_003e9023:
      bVar8 = false;
    }
    else {
LAB_003e8e9e:
      if ((local_48.yp < rect->yp) || (rect->yp + rect->h < local_48.yp)) goto LAB_003e8ebe;
LAB_003e8ff1:
      bVar8 = qFuzzyCompare(&local_48,&local_58);
      if (bVar8) {
        iVar13 = 0;
      }
LAB_003e9027:
      bVar8 = true;
    }
    iVar12 = iVar11 + 1;
  } while (bVar8);
  bVar10 = true;
LAB_003e9074:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar10;
}

Assistant:

static bool qt_painterpath_check_crossing(const QPainterPath *path, const QRectF &rect)
{
    QPointF last_pt;
    QPointF last_start;
    enum { OnRect, InsideRect, OutsideRect} edgeStatus = OnRect;
    for (int i=0; i<path->elementCount(); ++i) {
        const QPainterPath::Element &e = path->elementAt(i);

        switch (e.type) {

        case QPainterPath::MoveToElement:
            if (i > 0
                && qFuzzyCompare(last_pt.x(), last_start.x())
                && qFuzzyCompare(last_pt.y(), last_start.y())
                && qt_painterpath_isect_line_rect(last_pt.x(), last_pt.y(),
                                                  last_start.x(), last_start.y(), rect))
                return true;
            last_start = last_pt = e;
            break;

        case QPainterPath::LineToElement:
            if (qt_painterpath_isect_line_rect(last_pt.x(), last_pt.y(), e.x, e.y, rect))
                return true;
            last_pt = e;
            break;

        case QPainterPath::CurveToElement:
            {
                QPointF cp2 = path->elementAt(++i);
                QPointF ep = path->elementAt(++i);
                QBezier bezier = QBezier::fromPoints(last_pt, e, cp2, ep);
                if (qt_isect_curve_horizontal(bezier, rect.top(), rect.left(), rect.right())
                    || qt_isect_curve_horizontal(bezier, rect.bottom(), rect.left(), rect.right())
                    || qt_isect_curve_vertical(bezier, rect.left(), rect.top(), rect.bottom())
                    || qt_isect_curve_vertical(bezier, rect.right(), rect.top(), rect.bottom()))
                    return true;
                last_pt = ep;
            }
            break;

        default:
            break;
        }
        // Handle crossing the edges of the rect at the end-points of individual sub-paths.
        // A point on on the edge itself is considered neither inside nor outside for this purpose.
        if (!pointOnEdge(rect, last_pt)) {
            bool contained = rect.contains(last_pt);
            switch (edgeStatus) {
            case OutsideRect:
                if (contained)
                    return true;
                break;
            case InsideRect:
                if (!contained)
                    return true;
                break;
            case OnRect:
                edgeStatus = contained ? InsideRect : OutsideRect;
                break;
            }
        } else {
            if (last_pt == last_start)
                edgeStatus = OnRect;
        }
    }

    // implicitly close last subpath
    if (last_pt != last_start
        && qt_painterpath_isect_line_rect(last_pt.x(), last_pt.y(),
                                          last_start.x(), last_start.y(), rect))
        return true;

    return false;
}